

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  ImGuiTabItem *pIVar4;
  ImGuiTabItem *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  ImDrawList *this;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  undefined8 uVar18;
  char buf [256];
  ImVec2 local_148;
  ImVec2 local_140;
  char local_138 [256];
  undefined1 local_38 [8];
  
  iVar2 = tab_bar->PrevFrameVisible;
  iVar16 = GImGui->FrameCount + -2;
  pcVar12 = " *Inactive*";
  if (iVar16 <= iVar2) {
    pcVar12 = "";
  }
  iVar10 = ImFormatString(local_138,0x100,"%s 0x%08X (%d tabs)%s",label,(ulong)tab_bar->ID,
                          (ulong)(uint)(tab_bar->Tabs).Size,pcVar12);
  iVar11 = ImFormatString(local_138 + iVar10,0x100 - (long)iVar10,"  { ");
  pcVar12 = local_138 + iVar10 + iVar11;
  if ((tab_bar->Tabs).Size < 1) {
    pcVar14 = " } ";
  }
  else {
    lVar17 = 0;
    lVar13 = 0;
    do {
      pIVar4 = (tab_bar->Tabs).Data;
      pcVar14 = ", ";
      if (lVar17 == 0) {
        pcVar14 = "";
      }
      if ((*(long *)((long)&pIVar4->Window + lVar17) != 0) ||
         (*(int *)((long)&pIVar4->NameOffset + lVar17) != -1)) {
        ImGuiTabBar::GetTabName(tab_bar,(ImGuiTabItem *)((long)&pIVar4->ID + lVar17));
      }
      iVar10 = ImFormatString(pcVar12,(size_t)(local_38 + -(long)pcVar12),"%s\'%s\'",pcVar14);
      pcVar12 = pcVar12 + iVar10;
      lVar13 = lVar13 + 1;
      iVar10 = (tab_bar->Tabs).Size;
      iVar11 = 3;
      if (iVar10 < 3) {
        iVar11 = iVar10;
      }
      lVar17 = lVar17 + 0x30;
    } while (lVar13 < iVar11);
    pcVar14 = " } ";
    if (3 < iVar10) {
      pcVar14 = " ... }";
    }
  }
  ImFormatString(pcVar12,(size_t)(local_38 + -(long)pcVar12),pcVar14);
  if (iVar2 < iVar16) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
  }
  bVar8 = TreeNode(label,"%s",local_138);
  if (iVar2 < iVar16) {
    PopStyleColor(1);
  }
  else {
    bVar9 = IsItemHovered(0);
    if (bVar9) {
      this = GetViewportDrawList(GImGui->CurrentWindow->Viewport,1,"##Foreground");
      ImDrawList::AddRect(this,&(tab_bar->BarRect).Min,&(tab_bar->BarRect).Max,0xff00ffff,0.0,0,1.0)
      ;
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMinX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMaxX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
    }
  }
  if (bVar8) {
    if (0 < (tab_bar->Tabs).Size) {
      lVar13 = 0;
      uVar15 = 0;
      do {
        pIVar5 = (tab_bar->Tabs).Data;
        pIVar4 = (ImGuiTabItem *)((long)&pIVar5->ID + lVar13);
        PushID(pIVar4);
        bVar8 = SmallButton("<");
        if (bVar8) {
          TabBarQueueReorder(tab_bar,pIVar4,-1);
        }
        pIVar6 = GImGui->CurrentWindow;
        pIVar6->WriteAccessed = true;
        if (pIVar6->SkipItems == false) {
          fVar1 = (pIVar6->DC).CursorPosPrevLine.y;
          (pIVar6->DC).CursorPos.x = (pIVar6->DC).CursorPosPrevLine.x + 2.0;
          (pIVar6->DC).CursorPos.y = fVar1;
          (pIVar6->DC).CurrLineSize = (pIVar6->DC).PrevLineSize;
          (pIVar6->DC).CurrLineTextBaseOffset = (pIVar6->DC).PrevLineTextBaseOffset;
        }
        bVar8 = SmallButton(">");
        if (bVar8) {
          TabBarQueueReorder(tab_bar,pIVar4,1);
        }
        pIVar7 = GImGui;
        pIVar6 = GImGui->CurrentWindow;
        pIVar6->WriteAccessed = true;
        if (pIVar6->SkipItems == false) {
          (pIVar6->DC).CursorPos.x =
               (pIVar7->Style).ItemSpacing.x + (pIVar6->DC).CursorPosPrevLine.x;
          (pIVar6->DC).CursorPos.y = (pIVar6->DC).CursorPosPrevLine.y;
          (pIVar6->DC).CurrLineSize = (pIVar6->DC).PrevLineSize;
          (pIVar6->DC).CurrLineTextBaseOffset = (pIVar6->DC).PrevLineTextBaseOffset;
        }
        uVar3 = *(uint *)((long)&pIVar5->ID + lVar13);
        uVar18 = 0x2a;
        if (uVar3 != tab_bar->SelectedTabId) {
          uVar18 = 0x20;
        }
        if ((*(long *)((long)&pIVar5->Window + lVar13) != 0) ||
           (pcVar12 = "???", *(int *)((long)&pIVar5->NameOffset + lVar13) != -1)) {
          pcVar12 = ImGuiTabBar::GetTabName(tab_bar,pIVar4);
        }
        Text("%02d%c Tab 0x%08X \'%s\' Offset: %.1f, Width: %.1f/%.1f",
             (double)*(float *)((long)&pIVar5->Offset + lVar13),
             (double)*(float *)((long)&pIVar5->Width + lVar13),
             (double)*(float *)((long)&pIVar5->ContentWidth + lVar13),uVar15 & 0xffffffff,uVar18,
             (ulong)uVar3,pcVar12);
        PopID();
        uVar15 = uVar15 + 1;
        lVar13 = lVar13 + 0x30;
      } while ((long)uVar15 < (long)(tab_bar->Tabs).Size);
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    p += ImFormatString(p, buf_end - p, "  { ");
    for (int tab_n = 0; tab_n < ImMin(tab_bar->Tabs.Size, 3); tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        p += ImFormatString(p, buf_end - p, "%s'%s'",
            tab_n > 0 ? ", " : "", (tab->Window || tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???");
    }
    p += ImFormatString(p, buf_end - p, (tab_bar->Tabs.Size > 3) ? " ... }" : " } ");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(label, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->Window || tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???", tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}